

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldState.cpp
# Opt level: O2

void __thiscall AI::WorldState::pushChanges(WorldState *this,Task *task)

{
  mapped_type_conflict mVar1;
  mapped_type mVar2;
  float fVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  mapped_type_conflict *pmVar7;
  mapped_type_conflict *pmVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  copiedVectors;
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  copiedValues;
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  copiedFlags;
  StateChanges changed;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  local_180;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  local_150;
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  local_120;
  StateChanges local_f0;
  
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::_Rb_tree(&local_120,&(task->modifiedFlags)._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::_Rb_tree(&local_150,&(task->modifiedValues)._M_t);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::_Rb_tree(&local_180,&(task->modifiedVectors)._M_t);
  for (p_Var6 = (task->modifiedFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(task->modifiedFlags)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pmVar4 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)&local_120,&p_Var6[1]._M_color);
    pmVar5 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)this,&p_Var6[1]._M_color);
    mVar2 = *pmVar4;
    *pmVar4 = *pmVar5;
    *pmVar5 = mVar2;
  }
  for (p_Var6 = (task->modifiedValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(task->modifiedValues)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pmVar7 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[]((map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
                           *)&local_150,&p_Var6[1]._M_color);
    pmVar8 = std::
             map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
             ::operator[](&(this->current).values,&p_Var6[1]._M_color);
    mVar1 = *pmVar7;
    *pmVar7 = *pmVar8;
    *pmVar8 = mVar1;
  }
  for (p_Var6 = (task->modifiedVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(task->modifiedVectors)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pmVar9 = std::
             map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
             ::operator[]((map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
                           *)&local_180,&p_Var6[1]._M_color);
    pmVar10 = std::
              map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
              ::operator[](&(this->current).vectors,&p_Var6[1]._M_color);
    local_f0.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)pmVar9->z;
    local_f0.state.flags._M_t._M_impl._0_4_ = pmVar9->x;
    local_f0.state.flags._M_t._M_impl._4_4_ = pmVar9->y;
    pmVar9->z = pmVar10->z;
    fVar3 = pmVar10->y;
    pmVar9->x = pmVar10->x;
    pmVar9->y = fVar3;
    pmVar10->z = (float)local_f0.state.flags._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    pmVar10->x = (float)local_f0.state.flags._M_t._M_impl._0_4_;
    pmVar10->y = (float)local_f0.state.flags._M_t._M_impl._4_4_;
  }
  StateChanges::StateChanges(&local_f0);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::operator=((_Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
               *)&local_f0,&local_120);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::operator=(&local_f0.state.values._M_t,&local_150);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::operator=(&local_f0.state.vectors._M_t,&local_180);
  std::vector<AI::StateChanges,std::allocator<AI::StateChanges>>::emplace_back<AI::StateChanges&>
            ((vector<AI::StateChanges,std::allocator<AI::StateChanges>> *)&this->changes,&local_f0);
  StateChanges::~StateChanges(&local_f0);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_Math::Vector3>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::~_Rb_tree(&local_180);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_float>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_float>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::~_Rb_tree(&local_150);
  std::
  _Rb_tree<WorldStateIdentifier,_std::pair<const_WorldStateIdentifier,_bool>,_std::_Select1st<std::pair<const_WorldStateIdentifier,_bool>_>,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::~_Rb_tree(&local_120);
  return;
}

Assistant:

void WorldState::pushChanges(Task& task)
	{
		auto copiedFlags = task.modifiedFlags;
		auto copiedValues = task.modifiedValues;
		auto copiedVectors = task.modifiedVectors;

		for (auto& flag : task.modifiedFlags)
		{			
			std::swap(copiedFlags[flag.first], current.flags[flag.first]);
		}

		for (auto& value : task.modifiedValues)
		{			
			std::swap(copiedValues[value.first], current.values[value.first]);
		}

		for (auto& vector : task.modifiedVectors)
		{
			std::swap(copiedVectors[vector.first], current.vectors[vector.first]);
		}

		StateChanges changed;
		changed.state.flags = std::move(copiedFlags);
		changed.state.values = std::move(copiedValues);
		changed.state.vectors = std::move(copiedVectors);

		changes.emplace_back(changed);
	}